

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall pbrt::Image::SetChannel(Image *this,Point2i p,int c,Float value)

{
  PixelFormat PVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  float fVar10;
  span<const_float> vin;
  span<const_float> vin_00;
  span<unsigned_char> vout;
  span<unsigned_char> vout_00;
  string ret;
  float local_40;
  int local_3c;
  Tuple2<pbrt::Point2,_int> local_38;
  string local_30;
  
  local_40 = value;
  local_3c = c;
  local_38 = p.super_Tuple2<pbrt::Point2,_int>;
  if (NAN(value)) {
    if (LOGGING_LogLevel < 2) {
      local_30._M_string_length = 0;
      local_30.field_2._M_local_buf[0] = '\0';
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      detail::stringPrintfRecursive<int&,int&,int&>
                (&local_30,"NaN at pixel %d,%d comp %d",&local_38.x,&local_38.y,&local_3c);
      Log(Error,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
          ,0x1a5,local_30._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,
                        CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                                 local_30.field_2._M_local_buf[0]) + 1);
      }
    }
    local_40 = 0.0;
  }
  PVar1 = this->format;
  iVar5 = local_38.x;
  iVar7 = local_38.y;
  if (PVar1 == Float) {
    (this->p32).ptr
    [(long)((iVar7 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar5) *
           (int)(this->channelNames).nStored) + (long)local_3c] = local_40;
  }
  else if (PVar1 == Half) {
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar9 = vpandd_avx512vl(ZEXT416((uint)local_40),auVar9);
    fVar10 = auVar9._0_4_;
    if ((uint)fVar10 < 0x47800000) {
      if ((uint)fVar10 < 0x38800000) {
        uVar6 = SUB42(fVar10 + 0.5,0);
      }
      else {
        uVar6 = (ushort)((int)fVar10 + 0x8000fff + (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
      }
    }
    else {
      uVar6 = (0x7f800000 < (uint)fVar10 | 0x3e) << 9;
    }
    iVar8 = vmovmskps_avx(ZEXT416((uint)local_40));
    (this->p16).ptr
    [(long)((iVar7 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar5) *
           (int)(this->channelNames).nStored) + (long)local_3c].h = (ushort)(iVar8 << 0xf) | uVar6;
  }
  else {
    if (PVar1 != U256) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
               ,0x1b5,"Unhandled PixelFormat in Image::SetChannel()");
    }
    vout.ptr = (this->p8).ptr +
               (long)local_3c +
               (long)((iVar7 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar5) *
                     (int)(this->channelNames).nStored);
    uVar2 = (this->encoding).
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    if (uVar2 >> 0x31 == 0) {
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_40),SUB6416(ZEXT464(0x437f0000),0),
                               ZEXT416(0x3f000000));
      auVar9 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar4);
      uVar3 = vcmpss_avx512f(auVar4,ZEXT816(0) << 0x40,1);
      *vout.ptr = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar9._0_4_);
    }
    else if ((uVar2 & 0xffff000000000000) == 0x2000000000000) {
      vin.n = 1;
      vin.ptr = &local_40;
      vout.n = 1;
      sRGBColorEncoding::FromLinear((sRGBColorEncoding *)(uVar2 & 0xffffffffffff),vin,vout);
    }
    else {
      vin_00.n = 1;
      vin_00.ptr = &local_40;
      vout_00.n = 1;
      vout_00.ptr = vout.ptr;
      GammaColorEncoding::FromLinear((GammaColorEncoding *)(uVar2 & 0xffffffffffff),vin_00,vout_00);
    }
  }
  return;
}

Assistant:

inline void Image::SetChannel(Point2i p, int c, Float value) {
    // CHECK(!IsNaN(value));
    if (IsNaN(value)) {
#ifndef PBRT_IS_GPU_CODE
        LOG_ERROR("NaN at pixel %d,%d comp %d", p.x, p.y, c);
#endif
        value = 0;
    }

    switch (format) {
    case PixelFormat::U256:
        encoding.FromLinear({&value, 1}, {&p8[PixelOffset(p) + c], 1});
        break;
    case PixelFormat::Half:
        p16[PixelOffset(p) + c] = Half(value);
        break;
    case PixelFormat::Float:
        p32[PixelOffset(p) + c] = value;
        break;
    default:
        LOG_FATAL("Unhandled PixelFormat in Image::SetChannel()");
    }
}